

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::prod_test::iu_PeepTest_x_iutest_x_StaticProtectedPeep_Test::Body
          (iu_PeepTest_x_iutest_x_StaticProtectedPeep_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_3f0;
  Fixed local_3c0;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1d8;
  int local_40 [2];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_PeepTest_x_iutest_x_StaticProtectedPeep_Test *this_local;
  
  *iutest::detail::peep_tag<test::prod_test::iu_peep_tag_m_y<test::prod_test::ProtectedProdClass>>::
   value = 4;
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_40[1] = 4;
  local_40[0] = ProtectedProdClass::GetY();
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"4","ProtectedProdClass::GetY()",local_40 + 1,local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0xda,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_234 = 4;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_230,"4",
             "(*::iutest::detail::peep_tag< iu_peep_tag_m_y<ProtectedProdClass> >::value)",
             &local_234,
             iutest::detail::
             peep_tag<test::prod_test::iu_peep_tag_m_y<test::prod_test::ProtectedProdClass>>::value)
  ;
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              (&local_3f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0xdc,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_3f0,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper(&local_3f0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  return;
}

Assistant:

IUTEST(PeepTest, StaticProtectedPeep)
{
    IUTEST_PEEP_STATIC_GET(ProtectedProdClass, m_y) = 4;
    IUTEST_EXPECT_EQ(4, ProtectedProdClass::GetY());

    IUTEST_EXPECT_EQ(4, IUTEST_PEEP_STATIC_GET(ProtectedProdClass, m_y));
}